

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  long lVar1;
  iterator iVar2;
  uchar *puVar3;
  void *pvVar4;
  void *__src;
  void *pvVar5;
  byte bVar6;
  uint j;
  long lVar7;
  size_t __n;
  size_t __n_00;
  uchar **__args;
  uchar **ppuVar8;
  ulong uVar9;
  uint j_1;
  size_t __n_01;
  array<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  void *local_c8;
  long alStack_c0 [2];
  void *pvStack_b0;
  void *local_a8;
  undefined8 uStack_a0;
  void *local_98;
  void *pvStack_90;
  undefined8 local_88;
  size_t local_78;
  size_t local_70;
  void *local_68;
  void *local_60;
  size_t local_58;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  local_98 = (void *)0x0;
  pvStack_90 = (void *)0x0;
  local_a8 = (void *)0x0;
  uStack_a0 = 0;
  alStack_c0[1] = 0;
  pvStack_b0 = (void *)0x0;
  local_c8 = (void *)0x0;
  alStack_c0[0] = 0;
  local_88 = 0;
  bVar6 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    ppuVar8 = strings;
    do {
      lVar7 = 0;
      do {
        if (ppuVar8[lVar7] == (uchar *)0x0) goto LAB_0021bebe;
        abStack_50[lVar7] = ppuVar8[lVar7][depth];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      lVar7 = 0;
      __args = ppuVar8;
      do {
        lVar1 = (ulong)(abStack_50[lVar7] == bVar6) + (ulong)(bVar6 < abStack_50[lVar7]) * 2;
        iVar2._M_current = (uchar **)alStack_c0[lVar1 * 3];
        if (iVar2._M_current == (uchar **)alStack_c0[lVar1 * 3 + 1]) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>
                    ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                     (&local_c8 + lVar1 * 3),iVar2,__args);
        }
        else {
          *iVar2._M_current = *__args;
          alStack_c0[lVar1 * 3] = alStack_c0[lVar1 * 3] + 8;
        }
        lVar7 = lVar7 + 1;
        __args = __args + 1;
      } while (lVar7 != 0x20);
      uVar9 = uVar9 + 0x20;
      ppuVar8 = ppuVar8 + 0x20;
    } while (uVar9 < (N & 0xffffffffffffffe0));
  }
  lVar7 = N - uVar9;
  if (uVar9 <= N && lVar7 != 0) {
    ppuVar8 = strings + uVar9;
    do {
      puVar3 = *ppuVar8;
      if (puVar3 == (uchar *)0x0) {
LAB_0021bebe:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      lVar1 = (ulong)(puVar3[depth] == bVar6) + (ulong)(bVar6 < puVar3[depth]) * 2;
      iVar2._M_current = (uchar **)alStack_c0[lVar1 * 3];
      if (iVar2._M_current == (uchar **)alStack_c0[lVar1 * 3 + 1]) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>
                  ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)(&local_c8 + lVar1 * 3),
                   iVar2,ppuVar8);
      }
      else {
        *iVar2._M_current = puVar3;
        alStack_c0[lVar1 * 3] = alStack_c0[lVar1 * 3] + 8;
      }
      ppuVar8 = ppuVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pvVar5 = local_a8;
  __src = pvStack_b0;
  pvVar4 = local_c8;
  __n_00 = alStack_c0[0] - (long)local_c8;
  local_58 = (long)__n_00 >> 3;
  __n = (long)local_a8 - (long)pvStack_b0;
  local_78 = (long)__n >> 3;
  local_68 = pvStack_90;
  local_60 = local_98;
  __n_01 = (long)pvStack_90 - (long)local_98;
  local_70 = (long)__n_01 >> 3;
  if (local_78 + local_58 + local_70 == N) {
    if ((void *)alStack_c0[0] != local_c8) {
      memmove(strings,local_c8,__n_00);
    }
    if (pvVar5 != __src) {
      memmove((void *)((long)strings + __n_00),__src,__n);
    }
    if (local_68 != local_60) {
      memmove((void *)((long)strings + __n + __n_00),local_60,__n_01);
    }
    local_c8 = (void *)0x0;
    alStack_c0[0] = 0;
    alStack_c0[1] = 0;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    pvVar4 = pvStack_b0;
    pvStack_b0 = (void *)0x0;
    local_a8 = (void *)0x0;
    uStack_a0 = 0;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    pvVar4 = local_98;
    local_98 = (void *)0x0;
    pvStack_90 = (void *)0x0;
    local_88 = 0;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              (strings,local_58,depth);
    if (bVar6 != 0) {
      multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                ((uchar **)((long)strings + __n_00),local_78,depth + 1);
    }
    multikey_dynamic<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
              ((uchar **)((long)strings + __n + __n_00),local_70,depth);
    lVar7 = 0x30;
    do {
      if (*(void **)((long)&local_c8 + lVar7) != (void *)0x0) {
        operator_delete(*(void **)((long)&local_c8 + lVar7));
      }
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    return;
  }
  __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                ,0x5d,
                "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
               );
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}